

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVM.pb.cc
# Opt level: O3

void __thiscall
CoreML::Specification::SupportVectorClassifier::MergeFrom
          (SupportVectorClassifier *this,SupportVectorClassifier *from)

{
  int iVar1;
  void *pvVar2;
  LogMessage *pLVar3;
  Kernel *this_00;
  SparseSupportVectors *this_01;
  DenseSupportVectors *this_02;
  StringVector *this_03;
  Int64Vector *this_04;
  StringVector *from_00;
  Int64Vector *from_01;
  Kernel *from_02;
  SparseSupportVectors *from_03;
  DenseSupportVectors *from_04;
  LogFinisher local_51;
  LogMessage local_50;
  
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/build_O3/mlmodel/format/SVM.pb.cc"
               ,0xfa5);
    pLVar3 = google::protobuf::internal::LogMessage::operator<<
                       (&local_50,"CHECK failed: (&from) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&local_51,pLVar3);
    google::protobuf::internal::LogMessage::~LogMessage(&local_50);
  }
  pvVar2 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
           .ptr_;
  if (((ulong)pvVar2 & 1) != 0) {
    google::protobuf::internal::InternalMetadataWithArenaLite::DoMergeFrom
              (&this->_internal_metadata_,(string *)((ulong)pvVar2 & 0xfffffffffffffffe));
  }
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x4b6);
    pLVar3 = google::protobuf::internal::LogMessage::operator<<
                       (&local_50,"CHECK failed: (&other) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&local_51,pLVar3);
    google::protobuf::internal::LogMessage::~LogMessage(&local_50);
  }
  iVar1 = (from->numberofsupportvectorsperclass_).current_size_;
  if (iVar1 != 0) {
    google::protobuf::RepeatedField<int>::Reserve
              (&this->numberofsupportvectorsperclass_,
               iVar1 + (this->numberofsupportvectorsperclass_).current_size_);
    memcpy(((this->numberofsupportvectorsperclass_).rep_)->elements +
           (this->numberofsupportvectorsperclass_).current_size_,
           ((from->numberofsupportvectorsperclass_).rep_)->elements,
           (long)(from->numberofsupportvectorsperclass_).current_size_ << 2);
    (this->numberofsupportvectorsperclass_).current_size_ =
         (this->numberofsupportvectorsperclass_).current_size_ +
         (from->numberofsupportvectorsperclass_).current_size_;
  }
  google::protobuf::internal::RepeatedPtrFieldBase::
  MergeFrom<google::protobuf::RepeatedPtrField<CoreML::Specification::Coefficients>::TypeHandler>
            (&(this->coefficients_).super_RepeatedPtrFieldBase,
             &(from->coefficients_).super_RepeatedPtrFieldBase);
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x4b6);
    pLVar3 = google::protobuf::internal::LogMessage::operator<<
                       (&local_50,"CHECK failed: (&other) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&local_51,pLVar3);
    google::protobuf::internal::LogMessage::~LogMessage(&local_50);
  }
  iVar1 = (from->rho_).current_size_;
  if (iVar1 != 0) {
    google::protobuf::RepeatedField<double>::Reserve(&this->rho_,iVar1 + (this->rho_).current_size_)
    ;
    memcpy(((this->rho_).rep_)->elements + (this->rho_).current_size_,((from->rho_).rep_)->elements,
           (long)(from->rho_).current_size_ << 3);
    (this->rho_).current_size_ = (this->rho_).current_size_ + (from->rho_).current_size_;
  }
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x4b6);
    pLVar3 = google::protobuf::internal::LogMessage::operator<<
                       (&local_50,"CHECK failed: (&other) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&local_51,pLVar3);
    google::protobuf::internal::LogMessage::~LogMessage(&local_50);
  }
  iVar1 = (from->proba_).current_size_;
  if (iVar1 != 0) {
    google::protobuf::RepeatedField<double>::Reserve
              (&this->proba_,iVar1 + (this->proba_).current_size_);
    memcpy(((this->proba_).rep_)->elements + (this->proba_).current_size_,
           ((from->proba_).rep_)->elements,(long)(from->proba_).current_size_ << 3);
    (this->proba_).current_size_ = (this->proba_).current_size_ + (from->proba_).current_size_;
  }
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x4b6);
    pLVar3 = google::protobuf::internal::LogMessage::operator<<
                       (&local_50,"CHECK failed: (&other) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&local_51,pLVar3);
    google::protobuf::internal::LogMessage::~LogMessage(&local_50);
  }
  iVar1 = (from->probb_).current_size_;
  if (iVar1 != 0) {
    google::protobuf::RepeatedField<double>::Reserve
              (&this->probb_,iVar1 + (this->probb_).current_size_);
    memcpy(((this->probb_).rep_)->elements + (this->probb_).current_size_,
           ((from->probb_).rep_)->elements,(long)(from->probb_).current_size_ << 3);
    (this->probb_).current_size_ = (this->probb_).current_size_ + (from->probb_).current_size_;
  }
  from_02 = from->kernel_;
  if (from_02 != (Kernel *)0x0 &&
      from != (SupportVectorClassifier *)&_SupportVectorClassifier_default_instance_) {
    this_00 = this->kernel_;
    if (this_00 == (Kernel *)0x0) {
      this_00 = (Kernel *)operator_new(0x20);
      Kernel::Kernel(this_00);
      this->kernel_ = this_00;
      from_02 = from->kernel_;
    }
    if (from_02 == (Kernel *)0x0) {
      from_02 = (Kernel *)&_Kernel_default_instance_;
    }
    Kernel::MergeFrom(this_00,from_02);
  }
  if (from->_oneof_case_[0] == 4) {
    if (this->_oneof_case_[0] == 4) {
      this_02 = (this->supportVectors_).densesupportvectors_;
LAB_0024f13a:
      from_04 = (from->supportVectors_).densesupportvectors_;
    }
    else {
      clear_supportVectors(this);
      this->_oneof_case_[0] = 4;
      this_02 = (DenseSupportVectors *)operator_new(0x30);
      DenseSupportVectors::DenseSupportVectors(this_02);
      (this->supportVectors_).densesupportvectors_ = this_02;
      if (from->_oneof_case_[0] == 4) goto LAB_0024f13a;
      protobuf_SVM_2eproto::InitDefaults();
      from_04 = (DenseSupportVectors *)&_DenseSupportVectors_default_instance_;
    }
    DenseSupportVectors::MergeFrom(this_02,from_04);
  }
  else if (from->_oneof_case_[0] == 3) {
    if (this->_oneof_case_[0] == 3) {
      this_01 = (this->supportVectors_).sparsesupportvectors_;
LAB_0024f0f9:
      from_03 = (from->supportVectors_).sparsesupportvectors_;
    }
    else {
      clear_supportVectors(this);
      this->_oneof_case_[0] = 3;
      this_01 = (SparseSupportVectors *)operator_new(0x30);
      SparseSupportVectors::SparseSupportVectors(this_01);
      (this->supportVectors_).sparsesupportvectors_ = this_01;
      if (from->_oneof_case_[0] == 3) goto LAB_0024f0f9;
      protobuf_SVM_2eproto::InitDefaults();
      from_03 = (SparseSupportVectors *)&_SparseSupportVectors_default_instance_;
    }
    SparseSupportVectors::MergeFrom(this_01,from_03);
  }
  if (from->_oneof_case_[1] != 0x65) {
    if (from->_oneof_case_[1] != 100) {
      return;
    }
    if (this->_oneof_case_[1] == 100) {
      this_03 = (this->ClassLabels_).stringclasslabels_;
    }
    else {
      clear_ClassLabels(this);
      this->_oneof_case_[1] = 100;
      this_03 = (StringVector *)operator_new(0x30);
      StringVector::StringVector(this_03);
      (this->ClassLabels_).stringclasslabels_ = this_03;
      if (from->_oneof_case_[1] != 100) {
        from_00 = StringVector::default_instance();
        goto LAB_0024f231;
      }
    }
    from_00 = (from->ClassLabels_).stringclasslabels_;
LAB_0024f231:
    StringVector::MergeFrom(this_03,from_00);
    return;
  }
  if (this->_oneof_case_[1] == 0x65) {
    this_04 = (this->ClassLabels_).int64classlabels_;
  }
  else {
    clear_ClassLabels(this);
    this->_oneof_case_[1] = 0x65;
    this_04 = (Int64Vector *)operator_new(0x28);
    Int64Vector::Int64Vector(this_04);
    (this->ClassLabels_).int64classlabels_ = this_04;
    if (from->_oneof_case_[1] != 0x65) {
      from_01 = Int64Vector::default_instance();
      goto LAB_0024f243;
    }
  }
  from_01 = (from->ClassLabels_).int64classlabels_;
LAB_0024f243:
  Int64Vector::MergeFrom(this_04,from_01);
  return;
}

Assistant:

void SupportVectorClassifier::MergeFrom(const SupportVectorClassifier& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:CoreML.Specification.SupportVectorClassifier)
  GOOGLE_DCHECK_NE(&from, this);
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  numberofsupportvectorsperclass_.MergeFrom(from.numberofsupportvectorsperclass_);
  coefficients_.MergeFrom(from.coefficients_);
  rho_.MergeFrom(from.rho_);
  proba_.MergeFrom(from.proba_);
  probb_.MergeFrom(from.probb_);
  if (from.has_kernel()) {
    mutable_kernel()->::CoreML::Specification::Kernel::MergeFrom(from.kernel());
  }
  switch (from.supportVectors_case()) {
    case kSparseSupportVectors: {
      mutable_sparsesupportvectors()->::CoreML::Specification::SparseSupportVectors::MergeFrom(from.sparsesupportvectors());
      break;
    }
    case kDenseSupportVectors: {
      mutable_densesupportvectors()->::CoreML::Specification::DenseSupportVectors::MergeFrom(from.densesupportvectors());
      break;
    }
    case SUPPORTVECTORS_NOT_SET: {
      break;
    }
  }
  switch (from.ClassLabels_case()) {
    case kStringClassLabels: {
      mutable_stringclasslabels()->::CoreML::Specification::StringVector::MergeFrom(from.stringclasslabels());
      break;
    }
    case kInt64ClassLabels: {
      mutable_int64classlabels()->::CoreML::Specification::Int64Vector::MergeFrom(from.int64classlabels());
      break;
    }
    case CLASSLABELS_NOT_SET: {
      break;
    }
  }
}